

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printers_tests.cpp
# Opt level: O0

void __thiscall
iu_PrintToTest_x_iutest_x_IutestAnyString_Test::iu_PrintToTest_x_iutest_x_IutestAnyString_Test
          (iu_PrintToTest_x_iutest_x_IutestAnyString_Test *this)

{
  iu_PrintToTest_x_iutest_x_IutestAnyString_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_PrintToTest_x_iutest_x_IutestAnyString_Test_001cdf10;
  return;
}

Assistant:

IUTEST(PrintToTest, IutestAnyString)
{
    ::iutest::any a = "any-test";
#if !defined(IUTEST_NO_ARGUMENT_DEPENDENT_LOOKUP)
    LogChecker ck("any-test");
    IUTEST_PRINTTOSTRING_EQ(ck, a);
#else
    LogChecker ck("-Byte object");
    IUTEST_PRINTTOSTRING_CONTAIN(ck, a);
#endif
    IUTEST_STREAMOUT_CHECK(a);
}